

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

ContiguousMemoryRange __thiscall
protozero::ScatteredHeapBuffer::GetNewBuffer(ScatteredHeapBuffer *this)

{
  uint __errnum;
  pointer pSVar1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  code *pcVar3;
  ulong uVar4;
  char *fname;
  uint *puVar5;
  char *pcVar6;
  ContiguousMemoryRange CVar7;
  
  if (this->writer_ != (ScatteredStreamWriter *)0x0) {
    AdjustUsedSizeOfCurrentSlice(this);
    if ((this->cached_slice_).buffer_._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) {
      std::
      vector<protozero::ScatteredHeapBuffer::Slice,std::allocator<protozero::ScatteredHeapBuffer::Slice>>
      ::emplace_back<unsigned_long&>
                ((vector<protozero::ScatteredHeapBuffer::Slice,std::allocator<protozero::ScatteredHeapBuffer::Slice>>
                  *)&this->slices_,&this->next_slice_size_);
    }
    else {
      perfetto::std::
      vector<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
      ::emplace_back<protozero::ScatteredHeapBuffer::Slice>(&this->slices_,&this->cached_slice_);
    }
    uVar4 = this->next_slice_size_ * 2;
    if (this->maximum_slice_size_ <= uVar4) {
      uVar4 = this->maximum_slice_size_;
    }
    this->next_slice_size_ = uVar4;
    pSVar1 = (this->slices_).
             super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var2._M_head_impl =
         pSVar1[-1].buffer_._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    CVar7.end = _Var2._M_head_impl + pSVar1[-1].size_;
    CVar7.begin = _Var2._M_head_impl;
    return CVar7;
  }
  fname = perfetto::base::Basename
                    (
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
  puVar5 = (uint *)__errno_location();
  __errnum = *puVar5;
  pcVar6 = strerror(__errnum);
  perfetto::base::LogMessage
            (kLogError,fname,0x289a,"%s (errno: %d, %s)","PERFETTO_CHECK(writer_)",(ulong)__errnum,
             pcVar6);
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

protozero::ContiguousMemoryRange ScatteredHeapBuffer::GetNewBuffer() {
  PERFETTO_CHECK(writer_);
  AdjustUsedSizeOfCurrentSlice();

  if (cached_slice_.start()) {
    slices_.push_back(std::move(cached_slice_));
    PERFETTO_DCHECK(!cached_slice_.start());
  } else {
    slices_.emplace_back(next_slice_size_);
  }
  next_slice_size_ = std::min(maximum_slice_size_, next_slice_size_ * 2);
  return slices_.back().GetTotalRange();
}